

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BgzfStream::ReadBlock(BgzfStream *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  size_t sVar5;
  BamException *pBVar6;
  ulong uVar7;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  size_t blockLength;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char header [18];
  
  iVar3 = (*this->m_device->_vptr_IBamIODevice[7])();
  iVar4 = (*this->m_device->_vptr_IBamIODevice[5])(this->m_device,header,0x12);
  if (extraout_var_00 < 0) {
    std::__cxx11::string::string((string *)&local_a0,"device error: ",(allocator *)&blockLength);
    (*this->m_device->_vptr_IBamIODevice[9])(&local_58);
    std::operator+(&message,&local_a0,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a0);
    pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_a0,"BgzfStream::ReadBlock",(allocator *)&local_58)
    ;
    BamException::BamException(pBVar6,&local_a0,&message);
    __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
  }
  if (CONCAT44(extraout_var_00,iVar4) == 0x12) {
    bVar2 = CheckBlockHeader(header);
    if (!bVar2) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&message,"BgzfStream::ReadBlock",(allocator *)&local_58);
      std::__cxx11::string::string
                ((string *)&local_a0,"invalid block header contents",(allocator *)&blockLength);
      BamException::BamException(pBVar6,&message,&local_a0);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    blockLength = (ulong)(ushort)header._16_2_ + 1;
    pcVar1 = (this->m_compressedBlock).Buffer;
    *(undefined2 *)(pcVar1 + 0x10) = header._16_2_;
    *(undefined4 *)pcVar1 = header._0_4_;
    *(undefined4 *)(pcVar1 + 4) = header._4_4_;
    *(undefined4 *)(pcVar1 + 8) = header._8_4_;
    *(undefined4 *)(pcVar1 + 0xc) = header._12_4_;
    uVar7 = (ulong)(ushort)header._16_2_ - 0x11;
    iVar4 = (*this->m_device->_vptr_IBamIODevice[5])
                      (this->m_device,(this->m_compressedBlock).Buffer + 0x12,uVar7 & 0xffffffff);
    if (extraout_var_01 < 0) {
      std::__cxx11::string::string((string *)&local_a0,"device error: ",&local_a1);
      (*this->m_device->_vptr_IBamIODevice[9])(&local_58);
      std::operator+(&message,&local_a0,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_a0);
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_a0,"BgzfStream::ReadBlock",(allocator *)&local_58);
      BamException::BamException(pBVar6,&local_a0,&message);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    if (CONCAT44(extraout_var_01,iVar4) != uVar7) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&message,"BgzfStream::ReadBlock",(allocator *)&local_58);
      std::__cxx11::string::string((string *)&local_a0,"could not read data from block",&local_a1);
      BamException::BamException(pBVar6,&message,&local_a0);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    sVar5 = InflateBlock(this,&blockLength);
    if (this->m_blockLength != 0) {
      this->m_blockOffset = 0;
    }
    this->m_blockAddress = CONCAT44(extraout_var,iVar3);
    this->m_blockLength = (int32_t)sVar5;
  }
  else {
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&message,"BgzfStream::ReadBlock",(allocator *)&local_58);
      std::__cxx11::string::string
                ((string *)&local_a0,"invalid block header size",(allocator *)&blockLength);
      BamException::BamException(pBVar6,&message,&local_a0);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    this->m_blockLength = 0;
  }
  return;
}

Assistant:

void BgzfStream::ReadBlock()
{

    BT_ASSERT_X(m_device, "BgzfStream::ReadBlock() - trying to read from null IO device");

    // store block's starting address
    const int64_t blockAddress = m_device->Tell();

    // read block header from file
    char header[Constants::BGZF_BLOCK_HEADER_LENGTH];
    int64_t numBytesRead = m_device->Read(header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // if block header empty
    if (numBytesRead == 0) {
        m_blockLength = 0;
        return;
    }

    // if block header invalid size
    if (numBytesRead != static_cast<int8_t>(Constants::BGZF_BLOCK_HEADER_LENGTH))
        throw BamException("BgzfStream::ReadBlock", "invalid block header size");

    // validate block header contents
    if (!BgzfStream::CheckBlockHeader(header))
        throw BamException("BgzfStream::ReadBlock", "invalid block header contents");

    // copy header contents to compressed buffer
    const std::size_t blockLength = BamTools::UnpackUnsignedShort(&header[16]) + 1;
    memcpy(m_compressedBlock.Buffer, header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // read remainder of block
    const std::size_t remaining = blockLength - Constants::BGZF_BLOCK_HEADER_LENGTH;
    numBytesRead =
        m_device->Read(&m_compressedBlock.Buffer[Constants::BGZF_BLOCK_HEADER_LENGTH], remaining);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // check that we read in expected numBytes
    if (numBytesRead != static_cast<int64_t>(remaining))
        throw BamException("BgzfStream::ReadBlock", "could not read data from block");

    // decompress block data
    const std::size_t newBlockLength = InflateBlock(blockLength);

    // update block data
    if (m_blockLength != 0) m_blockOffset = 0;
    m_blockAddress = blockAddress;
    m_blockLength = newBlockLength;
}